

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O0

pair<char,_int> *
eastl::copy<eastl::pair<char,int>*,eastl::pair<char,int>*>
          (pair<char,_int> *first,pair<char,_int> *last,pair<char,_int> *result)

{
  pair<char,_int> *ppVar1;
  bool bOutputIsGenericIterator;
  bool bInputIsGenericIterator;
  pair<char,_int> *result_local;
  pair<char,_int> *last_local;
  pair<char,_int> *first_local;
  
  ppVar1 = copy_generic_iterator<false,false>::
           do_copy<eastl::pair<char,int>*,eastl::pair<char,int>*>(first,last,result);
  return ppVar1;
}

Assistant:

inline OutputIterator
    copy(InputIterator first, InputIterator last, OutputIterator result)
    {
        //#ifdef __GNUC__ // GCC has template depth problems and this shortcut may need to be enabled.
        //    return eastl::copy_chooser(first, last, result);
        //#else
            const bool bInputIsGenericIterator  = is_generic_iterator<InputIterator>::value;
            const bool bOutputIsGenericIterator = is_generic_iterator<OutputIterator>::value;
            return eastl::copy_generic_iterator<bInputIsGenericIterator, bOutputIsGenericIterator>::do_copy(first, last, result);
        //#endif
    }